

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexst.cpp
# Opt level: O3

void __thiscall icu_63::RegexStaticSets::~RegexStaticSets(RegexStaticSets *this)

{
  UnicodeSet *this_00;
  void *in_RSI;
  long lVar1;
  
  lVar1 = 0;
  do {
    this_00 = this->fPropSets[lVar1];
    if (this_00 != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(this_00);
    }
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
    this->fPropSets[lVar1] = (UnicodeSet *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xd);
  this->fRuleDigitsAlias = (UnicodeSet *)0x0;
  utext_close_63(this->fEmptyText);
  UnicodeSet::~UnicodeSet(&this->fUnescapeCharSet);
  lVar1 = 0x520;
  do {
    UnicodeSet::~UnicodeSet((UnicodeSet *)((long)this->fPropSets + lVar1));
    lVar1 = lVar1 + -0x58;
  } while (lVar1 != 0x1b0);
  return;
}

Assistant:

RegexStaticSets::~RegexStaticSets() {
    int32_t i;

    for (i=0; i<URX_LAST_SET; i++) {
        delete fPropSets[i];
        fPropSets[i] = NULL;
    }
    fRuleDigitsAlias = NULL;
    
    utext_close(fEmptyText);
}